

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_CheckTerrain
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  AActor *this;
  sector_t *sect;
  PClass *pPVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  char *__assertion;
  bool bVar6;
  double dVar7;
  FName local_24;
  DAngle local_20;
  DAngle local_18;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      this = (AActor *)(param->field_0).field_1.a;
      if (this != (AActor *)0x0) {
        if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar3 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
          (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
        }
        pPVar5 = (this->super_DThinker).super_DObject.Class;
        bVar6 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar2 && bVar6) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar6 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar2) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (!bVar6) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003e2876;
        }
      }
      sect = this->Sector;
      dVar1 = (this->__Pos).Z;
      dVar7 = ((sect->floorplane).normal.Y * (this->__Pos).Y +
              (sect->floorplane).normal.X * (this->__Pos).X + (sect->floorplane).D) *
              (sect->floorplane).negiC;
      if (((dVar1 == dVar7) && (!NAN(dVar1) && !NAN(dVar7))) &&
         ((sect->planes[0].Flags & 0x1d0U) != 0x100)) {
        if (sect->special == 0x76) {
          iVar4 = FTagManager::GetFirstSectorTag(&tagManager,sect);
          iVar3 = (iVar4 + -100) / 10;
          local_20.Degrees = (double)iVar3 * 45.0;
          AActor::Thrust(this,&local_20,(double)(iVar4 + iVar3 * -10 + -100) * 0.0625);
        }
        else if (sect->special == 0x73) {
          local_24.Index = 0xcb;
          local_18.Degrees = 0.0;
          P_DamageMobj(this,(AActor *)0x0,(AActor *)0x0,999,&local_24,0,&local_18);
        }
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003e2876:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1ab0,
                "int AF_AActor_A_CheckTerrain(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CheckTerrain)
{
	PARAM_SELF_PROLOGUE(AActor);

	sector_t *sec = self->Sector;

	if (self->Z() == sec->floorplane.ZatPoint(self) && sec->PortalBlocksMovement(sector_t::floor))
	{
		if (sec->special == Damage_InstantDeath)
		{
			P_DamageMobj(self, NULL, NULL, 999, NAME_InstantDeath);
		}
		else if (sec->special == Scroll_StrifeCurrent)
		{
			int anglespeed = tagManager.GetFirstSectorTag(sec) - 100;
			double speed = (anglespeed % 10) / 16.;
			DAngle an = (anglespeed / 10) * (360 / 8.);
			self->Thrust(an, speed);
		}
	}
	return 0;
}